

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::ConservativeScalMinMax
          (NavierStokesBase *this,MultiFab *Snew,int snew_comp,int new_density_comp,MultiFab *Sold,
          int sold_comp,int old_density_comp)

{
  bool bVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  FabArray<amrex::FArrayBox> *in_RDI;
  Array4<const_double> *vfrac;
  EBFArrayBoxFactory *ebfactory;
  Array4<const_double> *rhoo;
  Array4<const_double> *rhon;
  Array4<const_double> *so;
  Array4<double> *sn;
  Box *bx;
  MFIter mfi;
  AmrLevel *in_stack_fffffffffffffc70;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc78;
  undefined1 local_370 [7];
  undefined1 in_stack_fffffffffffffc97;
  FabArrayBase *in_stack_fffffffffffffc98;
  MFIter *in_stack_fffffffffffffca0;
  anon_class_320_5_628a01a8 *in_stack_fffffffffffffcb0;
  Box *in_stack_fffffffffffffcb8;
  MFIter *in_stack_fffffffffffffcd0;
  undefined1 auStack_2f0 [64];
  undefined1 auStack_2b0 [64];
  undefined1 auStack_270 [64];
  undefined1 local_230 [64];
  undefined1 *local_1f0;
  FabArray<amrex::FArrayBox> *local_1d8;
  undefined1 local_1d0 [64];
  undefined1 *local_190;
  undefined1 local_188 [64];
  undefined1 *local_148;
  undefined1 local_140 [64];
  undefined1 *local_100;
  undefined1 local_f8 [64];
  undefined1 *local_b8;
  undefined1 local_ac [172];
  
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97);
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_ac + 0x24));
    if (!bVar1) {
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffc70);
      return;
    }
    amrex::MFIter::tilebox(in_stack_fffffffffffffcd0);
    local_ac._28_8_ = local_ac;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_RDI,(MFIter *)in_stack_fffffffffffffc78,
               (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    local_b8 = local_f8;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_RDI,(MFIter *)in_stack_fffffffffffffc78,
               (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    local_100 = local_140;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_RDI,(MFIter *)in_stack_fffffffffffffc78,
               (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    local_148 = local_188;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_RDI,(MFIter *)in_stack_fffffffffffffc78,
               (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    local_190 = local_1d0;
    pFVar2 = amrex::AmrLevel::Factory(in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc78 =
         (FabArray<amrex::FArrayBox> *)
         __dynamic_cast(pFVar2,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                        &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (in_stack_fffffffffffffc78 == (FabArray<amrex::FArrayBox> *)0x0) break;
    local_1d8 = in_stack_fffffffffffffc78;
    amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffc70);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffc78,(MFIter *)in_stack_fffffffffffffc70);
    local_1f0 = local_230;
    in_stack_fffffffffffffc70 = (AmrLevel *)local_ac._28_8_;
    memcpy(local_370,local_1f0,0x3c);
    memcpy(&stack0xfffffffffffffcd0,local_100,0x3c);
    memcpy(auStack_2f0,local_190,0x3c);
    memcpy(auStack_2b0,local_b8,0x3c);
    memcpy(auStack_270,local_148,0x3c);
    amrex::
    ParallelFor<NavierStokesBase::ConservativeScalMinMax(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,int)::__0>
              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    amrex::MFIter::operator++((MFIter *)(local_ac + 0x24));
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::ConservativeScalMinMax ( amrex::MultiFab&       Snew, const int snew_comp, const int new_density_comp,
                                           amrex::MultiFab const& Sold, const int sold_comp, const int old_density_comp )
{

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const auto& bx = mfi.tilebox();

        const auto& sn   = Snew.array(mfi,snew_comp);
        const auto& so   = Sold.const_array(mfi,sold_comp);
        const auto& rhon = Snew.const_array(mfi,new_density_comp);
        const auto& rhoo = Sold.const_array(mfi,old_density_comp);
#ifdef AMREX_USE_EB
        const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
        const auto& vfrac = ebfactory.getVolFrac().const_array(mfi);
#endif

        amrex::ParallelFor(bx, [=]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real smn = std::numeric_limits<Real>::max();
            Real smx = std::numeric_limits<Real>::min();

#if (AMREX_SPACEDIM==3)
            int ks = -1;
            int ke =  1;
#else
            int ks = 0;
            int ke = 0;
#endif

            for (int kk = ks; kk <= ke; ++kk)
            {
                for (int jj = -1; jj <= 1; ++jj)
                {
                    for (int ii = -1; ii <= 1; ++ii)
                    {
#ifdef AMREX_USE_EB
                        if ( vfrac (i+ii,j+jj,k+kk) > 0. )
#endif
                        {
                            smn =  amrex::min(smn, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                            smx =  amrex::max(smx, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                        }
                    }
                }
            }
            sn(i,j,k) = amrex::min( amrex::max(sn(i,j,k)/rhon(i,j,k), smn), smx ) * rhon(i,j,k);
        });
    }
}